

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O1

void tb_set_jmp_target_mips(TranslationBlock *tb,int n,uintptr_t addr)

{
  *(int *)(*(long *)(tb->jmp_reset_offset + (long)n * 4) + *(long *)&tb->cflags) =
       ((int)addr - ((int)*(long *)(tb->jmp_reset_offset + (long)n * 4) + (int)*(long *)&tb->cflags)
       ) + -4;
  return;
}

Assistant:

void tb_set_jmp_target(TranslationBlock *tb, int n, uintptr_t addr)
{
    if (TCG_TARGET_HAS_direct_jump) {
        uintptr_t offset = tb->jmp_target_arg[n];
        uintptr_t tc_ptr = (uintptr_t)tb->tc.ptr;
        tb_target_set_jmp_target(tc_ptr, tc_ptr + offset, addr);
    } else {
        tb->jmp_target_arg[n] = addr;
    }
}